

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

long ndiSignedToLong(char *cp,int n)

{
  int iVar1;
  int local_34;
  long lStack_30;
  int sign;
  long result;
  int local_20;
  int c;
  int i;
  int n_local;
  char *cp_local;
  
  lStack_30 = 0;
  if (*cp == '+') {
    local_34 = 1;
  }
  else {
    if (*cp != '-') {
      return 0;
    }
    local_34 = -1;
  }
  local_20 = 1;
  while (((local_20 < n && (iVar1 = (int)cp[local_20], 0x2f < iVar1)) && (iVar1 < 0x3a))) {
    lStack_30 = lStack_30 * 10 + (long)(iVar1 + -0x30);
    local_20 = local_20 + 1;
  }
  return local_34 * lStack_30;
}

Assistant:

ndicapiExport long ndiSignedToLong(const char* cp, int n)
{
  int i;
  int c;
  long result = 0;
  int sign = 1;

  c = cp[0];

  if (c == '+')
  {
    sign = 1;
  }
  else if (c == '-')
  {
    sign = -1;
  }
  else
  {
    return 0;
  }

  for (i = 1; i < n; i++)
  {
    c = cp[i];
    if (c >= '0' && c <= '9')
    {
      result = (result * 10) + (c - '0');
    }
    else
    {
      break;
    }
  }

  return sign * result;
}